

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

bool __thiscall ON_MeshTopology::Create(ON_MeshTopology *this)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ON_Mesh *pOVar9;
  undefined8 uVar10;
  bool bVar11;
  int count;
  int iVar12;
  int iVar13;
  uint length;
  uint *puVar14;
  uint *puVar15;
  int *piVar16;
  ON_MeshTopologyVertex *pOVar17;
  ON_MeshTopologyEdge *pOVar18;
  void *__s;
  ON_MeshTopologyVertex *pOVar19;
  ON_MeshTopologyFace *pOVar20;
  ON_MeshFace *pOVar21;
  long lVar22;
  long lVar23;
  bool bVar24;
  bool local_129;
  bool bIsGood;
  ON_MeshTopologyFace *f_local_1;
  ON_MeshTopologyFace *topf;
  ON_MeshTopologyEdge *tope_3;
  ON_MeshTopologyFace *f_local;
  ON_MeshTopologyVertex *topv1;
  ON_MeshTopologyVertex *topv0;
  ON_MeshTopologyEdge *tope_2;
  ON_MeshTopologyVertex *topv_1;
  int *vei;
  ON_MeshTopologyEdge *tope_1;
  int *ve_count;
  ON_MeshTopologyEdge *tope;
  int *efindex;
  int etop_count;
  ON_MeshFaceSide *local_a0;
  ON_MeshFaceSide *e;
  ON_Workspace ws;
  ON_MeshFace f;
  int topfvi [4];
  int efi;
  int fi;
  int vi1;
  int vi0;
  int ecnt;
  int ei;
  bool rc;
  int topv_count;
  ON_MeshTopologyVertex *topv;
  int topvi;
  int vt1;
  int vt0;
  int topv_count_1;
  uint *vindex;
  int vcount;
  int fcount;
  int b32IsValid;
  int b32IsValid0;
  ON_MeshTopology *this_local;
  
  if (this->m_b32IsValid == 1) {
    this_local._7_1_ = true;
  }
  else {
    iVar1 = this->m_b32IsValid;
    if (iVar1 == 0) {
      this->m_b32IsValid = -1;
    }
    local_129 = iVar1 == 0 || iVar1 == -1;
    vcount = iVar1;
    if (local_129) {
      Destroy(this);
      vcount = 0;
      count = ON_Mesh::FaceCount(this->m_mesh);
      iVar12 = ON_Mesh::VertexCount(this->m_mesh);
      if (iVar12 != 0) {
        puVar14 = (uint *)GetIntArray(this,iVar12);
        ON_SimpleArray<int>::SetCapacity(&this->m_topv_map,(long)iVar12);
        ON_SimpleArray<int>::SetCount(&this->m_topv_map,iVar12);
        pOVar9 = this->m_mesh;
        puVar15 = (uint *)ON_SimpleArray<int>::Array(&this->m_topv_map);
        puVar15 = ON_Mesh::GetVertexLocationIds(pOVar9,0,puVar15,puVar14);
        if (puVar15 == (uint *)0x0) {
          Destroy(this);
        }
        else {
          piVar16 = ON_SimpleArray<int>::operator[](&this->m_topv_map,puVar14[iVar12 + -1]);
          iVar13 = *piVar16;
          ON_SimpleArray<int>::SetCapacity(&this->m_topv_map,(long)iVar12);
          ON_SimpleArray<int>::SetCount(&this->m_topv_map,iVar12);
          ON_SimpleArray<ON_MeshTopologyVertex>::SetCapacity(&this->m_topv,(long)(iVar13 + 1));
          topvi = 0;
          while (topvi < iVar12) {
            iVar13 = ON_SimpleArray<ON_MeshTopologyVertex>::Count(&this->m_topv);
            pOVar17 = ON_SimpleArray<ON_MeshTopologyVertex>::AppendNew(&this->m_topv);
            pOVar17->m_vi = (int *)(puVar14 + topvi);
            topv._4_4_ = topvi;
            do {
              topv._4_4_ = topv._4_4_ + 1;
              bVar24 = false;
              if (topv._4_4_ < iVar12) {
                piVar16 = ON_SimpleArray<int>::operator[](&this->m_topv_map,puVar14[topv._4_4_]);
                bVar24 = iVar13 == *piVar16;
              }
            } while (bVar24);
            pOVar17->m_v_count = topv._4_4_ - topvi;
            topvi = topv._4_4_;
          }
          iVar13 = ON_SimpleArray<ON_MeshTopologyVertex>::Count(&this->m_topv);
          if (((1 < iVar13) && (0 < count)) && (0 < iVar12)) {
            ON_Workspace::ON_Workspace((ON_Workspace *)&e);
            local_a0 = (ON_MeshFaceSide *)
                       ON_Workspace::GetMemory((ON_Workspace *)&e,(long)(count << 2) * 0x14);
            pOVar9 = this->m_mesh;
            puVar14 = (uint *)ON_SimpleArray<int>::Array(&this->m_topv_map);
            length = ON_Mesh::GetMeshFaceSideList(pOVar9,puVar14,&local_a0);
            if (0 < (int)length) {
              ON_MeshFaceSide::SortByVertexIndex(local_a0,(long)(int)length);
              efindex._0_4_ = 0;
              vi0 = 0;
              while (vi0 < (int)length) {
                lVar22 = (long)vi0;
                lVar23 = (long)vi0;
                do {
                  vi0 = vi0 + 1;
                  bVar24 = false;
                  if ((vi0 < (int)length) &&
                     (bVar24 = false, local_a0[vi0].m_vi[0] == local_a0[lVar22].m_vi[0])) {
                    bVar24 = local_a0[vi0].m_vi[1] == local_a0[lVar23].m_vi[1];
                  }
                } while (bVar24);
                efindex._0_4_ = (int)efindex + 1;
              }
              ON_SimpleArray<ON_MeshTopologyEdge>::SetCapacity(&this->m_tope,(long)(int)efindex);
              tope = (ON_MeshTopologyEdge *)GetIntArray(this,length);
              vi0 = 0;
              while (vi0 < (int)length) {
                pOVar18 = ON_SimpleArray<ON_MeshTopologyEdge>::AppendNew(&this->m_tope);
                uVar2 = local_a0[vi0].m_vi[0];
                pOVar18->m_topvi[0] = uVar2;
                uVar3 = local_a0[vi0].m_vi[1];
                pOVar18->m_topvi[1] = uVar3;
                pOVar18->m_topfi = tope->m_topvi;
                pOVar18->m_topf_count = 0;
                tope->m_topvi[0] = local_a0[vi0].m_fi;
                pOVar18->m_topf_count = pOVar18->m_topf_count + 1;
                while( true ) {
                  vi0 = vi0 + 1;
                  tope = (ON_MeshTopologyEdge *)(tope->m_topvi + 1);
                  bVar24 = false;
                  if ((vi0 < (int)length) && (bVar24 = false, local_a0[vi0].m_vi[0] == uVar2)) {
                    bVar24 = local_a0[vi0].m_vi[1] == uVar3;
                  }
                  if (!bVar24) break;
                  tope->m_topvi[0] = local_a0[vi0].m_fi;
                  pOVar18->m_topf_count = pOVar18->m_topf_count + 1;
                }
              }
              iVar12 = ON_SimpleArray<ON_MeshTopologyEdge>::Count(&this->m_tope);
              __s = onmalloc((long)iVar13 << 2);
              memset(__s,0,(long)iVar13 << 2);
              for (vi0 = 0; vi0 < iVar12; vi0 = vi0 + 1) {
                pOVar18 = ON_SimpleArray<ON_MeshTopologyEdge>::operator[](&this->m_tope,vi0);
                *(int *)((long)__s + (long)pOVar18->m_topvi[0] * 4) =
                     *(int *)((long)__s + (long)pOVar18->m_topvi[0] * 4) + 1;
                *(int *)((long)__s + (long)pOVar18->m_topvi[1] * 4) =
                     *(int *)((long)__s + (long)pOVar18->m_topvi[1] * 4) + 1;
              }
              topv_1 = (ON_MeshTopologyVertex *)GetIntArray(this,iVar12 * 2);
              for (fi = 0; fi < iVar13; fi = fi + 1) {
                pOVar17 = ON_SimpleArray<ON_MeshTopologyVertex>::operator[](&this->m_topv,fi);
                if (0 < *(int *)((long)__s + (long)fi * 4)) {
                  pOVar17->m_topei = &topv_1->m_tope_count;
                  topv_1 = (ON_MeshTopologyVertex *)
                           (&topv_1->m_tope_count + *(int *)((long)__s + (long)fi * 4));
                }
              }
              onfree(__s);
              for (vi0 = 0; vi0 < iVar12; vi0 = vi0 + 1) {
                pOVar18 = ON_SimpleArray<ON_MeshTopologyEdge>::operator[](&this->m_tope,vi0);
                pOVar17 = ON_SimpleArray<ON_MeshTopologyVertex>::operator[]
                                    (&this->m_topv,pOVar18->m_topvi[0]);
                pOVar19 = ON_SimpleArray<ON_MeshTopologyVertex>::operator[]
                                    (&this->m_topv,pOVar18->m_topvi[1]);
                iVar13 = pOVar17->m_tope_count;
                pOVar17->m_tope_count = iVar13 + 1;
                pOVar17->m_topei[iVar13] = vi0;
                iVar13 = pOVar19->m_tope_count;
                pOVar19->m_tope_count = iVar13 + 1;
                pOVar19->m_topei[iVar13] = vi0;
              }
              ON_SimpleArray<ON_MeshTopologyFace>::SetCapacity(&this->m_topf,(long)count);
              ON_SimpleArray<ON_MeshTopologyFace>::SetCount(&this->m_topf,count);
              pOVar20 = ON_SimpleArray<ON_MeshTopologyFace>::Array(&this->m_topf);
              memset(pOVar20,0,(long)count * 0x14);
              for (topfvi[3] = 0; topfvi[3] < count; topfvi[3] = topfvi[3] + 1) {
                pOVar20 = ON_SimpleArray<ON_MeshTopologyFace>::operator[](&this->m_topf,topfvi[3]);
                pOVar20->m_topei[0] = -1;
                pOVar20->m_topei[1] = -1;
                pOVar20->m_topei[2] = -1;
                pOVar20->m_topei[3] = -1;
              }
              for (vi0 = 0; vi0 < iVar12; vi0 = vi0 + 1) {
                pOVar18 = ON_SimpleArray<ON_MeshTopologyEdge>::operator[](&this->m_tope,vi0);
                for (topfvi[2] = 0; topfvi[2] < pOVar18->m_topf_count; topfvi[2] = topfvi[2] + 1) {
                  iVar13 = pOVar18->m_topfi[topfvi[2]];
                  pOVar21 = ON_SimpleArray<ON_MeshFace>::operator[](&this->m_mesh->m_F,iVar13);
                  ws.m_pMemBlk = *(ON_Workspace_MBLK **)pOVar21->vi;
                  uVar10 = *(undefined8 *)(pOVar21->vi + 2);
                  piVar16 = ON_SimpleArray<int>::operator[](&this->m_topv_map,(int)ws.m_pMemBlk);
                  iVar4 = *piVar16;
                  piVar16 = ON_SimpleArray<int>::operator[](&this->m_topv_map,ws.m_pMemBlk._4_4_);
                  iVar5 = *piVar16;
                  f.vi[0] = (int)uVar10;
                  piVar16 = ON_SimpleArray<int>::operator[](&this->m_topv_map,f.vi[0]);
                  iVar6 = *piVar16;
                  f.vi[1] = (int)((ulong)uVar10 >> 0x20);
                  piVar16 = ON_SimpleArray<int>::operator[](&this->m_topv_map,f.vi[1]);
                  iVar7 = *piVar16;
                  pOVar20 = ON_SimpleArray<ON_MeshTopologyFace>::operator[](&this->m_topf,iVar13);
                  iVar13 = pOVar18->m_topvi[0];
                  iVar8 = pOVar18->m_topvi[1];
                  if ((iVar13 == iVar7) && (iVar8 == iVar4)) {
                    pOVar20->m_topei[0] = vi0;
                    pOVar20->m_reve[0] = '\0';
                  }
                  else if ((iVar13 == iVar4) && (iVar8 == iVar5)) {
                    pOVar20->m_topei[1] = vi0;
                    pOVar20->m_reve[1] = '\0';
                  }
                  else if ((iVar13 == iVar5) && (iVar8 == iVar6)) {
                    pOVar20->m_topei[2] = vi0;
                    pOVar20->m_reve[2] = '\0';
                  }
                  else if ((iVar13 == iVar6) && (iVar8 == iVar7)) {
                    pOVar20->m_topei[3] = vi0;
                    pOVar20->m_reve[3] = '\0';
                  }
                  else if ((iVar8 == iVar7) && (iVar13 == iVar4)) {
                    pOVar20->m_topei[0] = vi0;
                    pOVar20->m_reve[0] = '\x01';
                  }
                  else if ((iVar8 == iVar4) && (iVar13 == iVar5)) {
                    pOVar20->m_topei[1] = vi0;
                    pOVar20->m_reve[1] = '\x01';
                  }
                  else if ((iVar8 == iVar5) && (iVar13 == iVar6)) {
                    pOVar20->m_topei[2] = vi0;
                    pOVar20->m_reve[2] = '\x01';
                  }
                  else if ((iVar8 == iVar6) && (iVar13 == iVar7)) {
                    pOVar20->m_topei[3] = vi0;
                    pOVar20->m_reve[3] = '\x01';
                  }
                }
              }
              for (topfvi[3] = 0; topfvi[3] < count; topfvi[3] = topfvi[3] + 1) {
                pOVar20 = ON_SimpleArray<ON_MeshTopologyFace>::operator[](&this->m_topf,topfvi[3]);
                bVar24 = false;
                if (((((-1 < pOVar20->m_topei[0]) && (-1 < pOVar20->m_topei[1])) &&
                     (-1 < pOVar20->m_topei[2])) &&
                    ((pOVar20->m_topei[0] != pOVar20->m_topei[1] &&
                     (pOVar20->m_topei[1] != pOVar20->m_topei[2])))) &&
                   (pOVar20->m_topei[2] != pOVar20->m_topei[0])) {
                  pOVar21 = ON_SimpleArray<ON_MeshFace>::operator[](&this->m_mesh->m_F,topfvi[3]);
                  bVar11 = ON_MeshFace::IsTriangle(pOVar21);
                  if (bVar11) {
                    bVar24 = true;
                    pOVar20->m_topei[3] = pOVar20->m_topei[2];
                  }
                  else if (((-1 < pOVar20->m_topei[3]) &&
                           (pOVar20->m_topei[0] != pOVar20->m_topei[3])) &&
                          ((pOVar20->m_topei[1] != pOVar20->m_topei[3] &&
                           (pOVar20->m_topei[2] != pOVar20->m_topei[3])))) {
                    bVar24 = true;
                  }
                }
                if (!bVar24) {
                  pOVar20->m_topei[0] = 0;
                  pOVar20->m_topei[1] = 0;
                  pOVar20->m_topei[2] = 0;
                  pOVar20->m_topei[3] = 0;
                  pOVar20->m_reve[0] = '\0';
                  pOVar20->m_reve[1] = '\0';
                  pOVar20->m_reve[2] = '\0';
                  pOVar20->m_reve[3] = '\0';
                }
              }
            }
            ON_Workspace::~ON_Workspace((ON_Workspace *)&e);
          }
          vcount = 1;
        }
      }
    }
    if (iVar1 != -1) {
      this->m_b32IsValid = vcount;
    }
    if (vcount != 1) {
      Destroy(this);
    }
    this_local._7_1_ = vcount == 1;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_MeshTopology::Create()
{
  // When -1 == m_b32IsValid, this ON_MeshTopology
  // is the m_top field on an ON_Mesh and is being
  // created in an ON_Mesh::Topology() call and a
  // sleep lock is used to keep ON_Mesh::Topology()
  // thread safe.
  //
  // When 0 == m_b32IsValid, this ON_MeshTopology
  // is being created stand alone.
  //
  // When 1 == m_b32IsValid, this ON_MeshTopology
  // is already created and valid.

  if ( 1 == m_b32IsValid )
    return true;

  const int b32IsValid0 = m_b32IsValid;

  if ( 0 == b32IsValid0 )
  {
    // no sleep lock is being used
    m_b32IsValid = -1;
  }
  int b32IsValid = b32IsValid0;

  while ( 0 == b32IsValid || -1 == b32IsValid ) 
  {
    // while() is for flow control - this is a while() {... break;} statement.
    Destroy();
    b32IsValid = 0;

    // build vertex topology information
    const int fcount = m_mesh->FaceCount();
    const int vcount = m_mesh->VertexCount();
    if ( 0 == vcount )
      break;

    unsigned int* vindex = (unsigned int*)GetIntArray(vcount);
    m_topv_map.SetCapacity( vcount );
    m_topv_map.SetCount( vcount );
    if (  0 == m_mesh->GetVertexLocationIds( 
      0, // first id
      (unsigned int*)m_topv_map.Array(), // vertex ids returned here
      vindex
      ) )
    {
      Destroy();
      break;
    }

    {
      int topv_count = m_topv_map[vindex[vcount-1]]+1;
      m_topv_map.SetCapacity( vcount );
      m_topv_map.SetCount( vcount );
      m_topv.SetCapacity( topv_count );
      int vt0, vt1, topvi;
      for (vt0 = 0; vt0 < vcount; vt0 = vt1)
      {
        topvi = m_topv.Count();
#if defined(ON_DEBUG)
        if ( topvi != m_topv_map[vindex[vt0]] )
        {
          // 20 April 2010 Dale Lear:
          //  If you get this error, save the mesh and tell Dale Lear.
          ON_ERROR("ON_MeshTopology::Create() - topvi != vertex id from GetVertexLocationIds()");
        }
#endif
        ON_MeshTopologyVertex& topv = m_topv.AppendNew();
        topv.m_vi = (const int*)(vindex+vt0);
        for ( vt1=vt0+1; vt1<vcount && topvi == m_topv_map[vindex[vt1]]; vt1++ ) {
          // empty
        }
        topv.m_v_count = vt1-vt0;
      }
    }

    // build edge topology information
    const int topv_count = m_topv.Count();
    if ( topv_count >= 2 ) 
    {
      bool rc = false;
      int ei, ecnt, vi0, vi1, fi, efi, topfvi[4];
      ON_MeshFace f;

      if ( fcount > 0 && vcount > 0 ) 
      {
        // When working on this code be sure to test bug# 9271 and 9254 and file fsv_r4.3dm
        ON_Workspace ws;
        ON_MeshFaceSide* e = (ON_MeshFaceSide*)ws.GetMemory( 4*fcount*sizeof(*e) );
        ecnt = m_mesh->GetMeshFaceSideList( (const unsigned int*)m_topv_map.Array(), e );
        
        if ( ecnt > 0 ) 
        {
          rc = true;
          ON_MeshFaceSide::SortByVertexIndex( e, ecnt );

          // count number of topological edges and allocate storage
          int etop_count = 0;
          ei = 0;
          while( ei < ecnt ) 
          {
            vi0 = e[ei].m_vi[0];
            vi1 = e[ei].m_vi[1];
            ei++;
            while (ei < ecnt && e[ei].m_vi[0] == (unsigned int)vi0 && e[ei].m_vi[1] == (unsigned int)vi1 )
              ei++;
            etop_count++;
          }
          m_tope.SetCapacity(etop_count);

          // fill in the m_tope[] array information
          int* efindex = GetIntArray(ecnt);
          for ( ei = 0; ei < ecnt; /*empty*/ )
          {
            ON_MeshTopologyEdge& tope = m_tope.AppendNew();
            tope.m_topvi[0] = (int)(vi0 = e[ei].m_vi[0]);
            tope.m_topvi[1] = (int)(vi1 = e[ei].m_vi[1]);
            tope.m_topfi = efindex;
            tope.m_topf_count = 0;
            *efindex++ = (int)e[ei].m_fi;
            tope.m_topf_count++;
            ei++;
            while( ei < ecnt && e[ei].m_vi[0] == (unsigned int)vi0 && e[ei].m_vi[1] == (unsigned int)vi1 ) 
            {
              *efindex++ = (int)e[ei].m_fi;
              tope.m_topf_count++;
              ei++;
            }
          }
          efindex = 0; // memory deallocated by ~ON_MeshTopology()

          // connect vertices to edges;
          ecnt = m_tope.Count();
          int* ve_count = (int*)onmalloc(topv_count*sizeof(*ve_count));
          // set ve_count[topvi] = number of edges that begin or end at m_topv[topvi]
          memset( ve_count, 0, topv_count*sizeof(*ve_count));
          for ( ei = 0; ei < ecnt; ei++ ) {
            const ON_MeshTopologyEdge& tope = m_tope[ei];
            ve_count[tope.m_topvi[0]]++;
            ve_count[tope.m_topvi[1]]++;
          }
          // allocate and distribute storage for the mopv.m_topei[] array
          int* vei = GetIntArray(2*ecnt);
          for ( vi0 = 0; vi0 < topv_count; vi0++ ) {
            ON_MeshTopologyVertex& topv = m_topv[vi0];
            if ( ve_count[vi0] > 0 ) {
              topv.m_topei = vei;
              vei += ve_count[vi0];
            }
          }
          onfree(ve_count); ve_count = 0;
          vei = 0; // memory deallocated by ~ON_MeshTopology()

          // fill in the m_topv[].m_topei[] values
          for ( ei = 0; ei < ecnt; ei++ ) {
            ON_MeshTopologyEdge& tope = m_tope[ei];
            ON_MeshTopologyVertex& topv0 = m_topv[tope.m_topvi[0]];
            ON_MeshTopologyVertex& topv1 = m_topv[tope.m_topvi[1]];
            vei = const_cast<int*>(topv0.m_topei);
            vei[topv0.m_tope_count++] = ei;
            vei = const_cast<int*>(topv1.m_topei);
            vei[topv1.m_tope_count++] = ei;
          }

          // build face topology information
          m_topf.SetCapacity(fcount);
          m_topf.SetCount(fcount);
          memset( m_topf.Array(), 0, fcount*sizeof(ON_MeshTopologyFace) );
          for ( fi = 0; fi < fcount; fi++ ) {
            ON_MeshTopologyFace& f_local = m_topf[fi];
            f_local.m_topei[0] = -1;
            f_local.m_topei[1] = -1;
            f_local.m_topei[2] = -1;
            f_local.m_topei[3] = -1;
          }
          for ( ei = 0; ei < ecnt; ei++ ) {
            ON_MeshTopologyEdge& tope = m_tope[ei];
            for (efi = 0; efi < tope.m_topf_count; efi++ ) {
              // Because ON_MeshFace.vi[2] == ON_MeshFace.vi[3] for triangles,
              // we have topf.m_topei[j] BEGIN at ON_MeshFace.vi[(j+3)%4] and END at ON_MeshFace.vi[j]
              fi = tope.m_topfi[efi];
              f = m_mesh->m_F[fi];
              topfvi[0] = m_topv_map[f.vi[0]];
              topfvi[1] = m_topv_map[f.vi[1]];
              topfvi[2] = m_topv_map[f.vi[2]];
              topfvi[3] = m_topv_map[f.vi[3]];
              ON_MeshTopologyFace& topf = m_topf[fi];
              vi0 = tope.m_topvi[0];
              vi1 = tope.m_topvi[1];
              // unroll loop for speed
              if      ( vi0 == topfvi[3] && vi1 == topfvi[0] ) {
                topf.m_topei[0] = ei;
                topf.m_reve[0] = 0;
              }
              else if ( vi0 == topfvi[0] && vi1 == topfvi[1] ) {
                topf.m_topei[1] = ei;
                topf.m_reve[1] = 0;
              }
              else if ( vi0 == topfvi[1] && vi1 == topfvi[2] ) {
                topf.m_topei[2] = ei;
                topf.m_reve[2] = 0;
              }
              else if ( vi0 == topfvi[2] && vi1 == topfvi[3] ) {
                topf.m_topei[3] = ei;
                topf.m_reve[3] = 0;
              }
              else if ( vi1 == topfvi[3] && vi0 == topfvi[0] ) {
                topf.m_topei[0] = ei;
                topf.m_reve[0] = 1;
              }
              else if ( vi1 == topfvi[0] && vi0 == topfvi[1] ) {
                topf.m_topei[1] = ei;
                topf.m_reve[1] = 1;
              }
              else if ( vi1 == topfvi[1] && vi0 == topfvi[2] ) {
                topf.m_topei[2] = ei;
                topf.m_reve[2] = 1;
              }
              else if ( vi1 == topfvi[2] && vi0 == topfvi[3] ) {
                topf.m_topei[3] = ei;
                topf.m_reve[3] = 1;
              }
            }
          }
          for ( fi = 0; fi < fcount; fi++ ) 
          {
            ON_MeshTopologyFace& f_local = m_topf[fi];
            bool bIsGood = false;
            if (    f_local.m_topei[0] >= 0 && f_local.m_topei[1] >= 0 && f_local.m_topei[2] >=0 
                 && f_local.m_topei[0] != f_local.m_topei[1] 
                 && f_local.m_topei[1] != f_local.m_topei[2] 
                 && f_local.m_topei[2] != f_local.m_topei[0] 
                 ) {
              if ( m_mesh->m_F[fi].IsTriangle() ) {
                bIsGood = true;
                f_local.m_topei[3] = f_local.m_topei[2];
              }
              else if (   f_local.m_topei[3] >= 0 
                       && f_local.m_topei[0] != f_local.m_topei[3] 
                       && f_local.m_topei[1] != f_local.m_topei[3] 
                       && f_local.m_topei[2] != f_local.m_topei[3] ) {
                bIsGood = true;
              }
            }
            if ( !bIsGood ) {
              f_local.m_topei[0] = 0;
              f_local.m_topei[1] = 0;
              f_local.m_topei[2] = 0;
              f_local.m_topei[3] = 0;
              f_local.m_reve[0] = 0;
              f_local.m_reve[1] = 0;
              f_local.m_reve[2] = 0;
              f_local.m_reve[3] = 0;
            }
          }

        }
      }
    }

    b32IsValid = 1;
    break;
  }

  if ( -1 != b32IsValid0 )
  {
    // no sleep lock is in use
    m_b32IsValid = b32IsValid;
  }

  if ( 1 != b32IsValid )
  {
    Destroy();
  }

  return (1 == b32IsValid);
}